

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O0

cupdlp_retcode
cupdlp_l2norm_scaling
          (CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
          cupdlp_float *rhs,CUPDLPscaling *scaling)

{
  int iVar1;
  double *upper_00;
  cupdlp_float *in_RCX;
  int *in_RDI;
  CUPDLPcsc *in_R9;
  double dVar2;
  int i_1;
  int i;
  int j;
  cupdlp_float *current_row_scaling;
  cupdlp_float *current_col_scaling;
  cupdlp_int nCols;
  cupdlp_int nRows;
  cupdlp_retcode retcode;
  int local_5c;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  cupdlp_float *rhs_00;
  undefined4 in_stack_ffffffffffffffc0;
  int len;
  int len_00;
  cupdlp_retcode cVar3;
  
  cVar3 = 0;
  len_00 = *in_RDI;
  len = in_RDI[1];
  rhs_00 = (cupdlp_float *)0x0;
  upper_00 = (double *)calloc((long)len,8);
  if (upper_00 == (double *)0x0) {
    cVar3 = 1;
  }
  else {
    rhs_00 = (cupdlp_float *)calloc((long)len_00,8);
    if (rhs_00 == (cupdlp_float *)0x0) {
      cVar3 = 1;
    }
    else {
      if (0 < len_00) {
        for (in_stack_ffffffffffffffac = 0; in_stack_ffffffffffffffac < len;
            in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
          if (*(int *)(*(long *)(in_RDI + 4) + (long)in_stack_ffffffffffffffac * 4) ==
              *(int *)(*(long *)(in_RDI + 4) + (long)(in_stack_ffffffffffffffac + 1) * 4)) {
            upper_00[in_stack_ffffffffffffffac] = 1.0;
          }
          else {
            dVar2 = GenNorm(upper_00,(cupdlp_int)((ulong)rhs_00 >> 0x20),
                            (cupdlp_float)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            dVar2 = sqrt(dVar2);
            upper_00[in_stack_ffffffffffffffac] = dVar2;
          }
        }
        for (in_stack_ffffffffffffffa8 = 0;
            in_stack_ffffffffffffffa8 < *(int *)(*(long *)(in_RDI + 4) + (long)len * 4);
            in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
          dVar2 = pow(*(double *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffa8 * 8),2.0);
          iVar1 = *(int *)(*(long *)(in_RDI + 6) + (long)in_stack_ffffffffffffffa8 * 4);
          rhs_00[iVar1] = dVar2 + rhs_00[iVar1];
        }
        for (local_5c = 0; local_5c < len_00; local_5c = local_5c + 1) {
          dVar2 = sqrt(rhs_00[local_5c]);
          dVar2 = sqrt(dVar2);
          rhs_00[local_5c] = dVar2;
          if ((rhs_00[local_5c] == 0.0) && (!NAN(rhs_00[local_5c]))) {
            rhs_00[local_5c] = 1.0;
          }
        }
      }
      scale_problem(in_R9,(cupdlp_float *)CONCAT44(cVar3,len_00),
                    (cupdlp_float *)CONCAT44(len,in_stack_ffffffffffffffc0),upper_00,rhs_00,
                    (cupdlp_float *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    in_RCX);
      cupdlp_cdot((cupdlp_float *)in_R9->colMatBeg,upper_00,len);
      cupdlp_cdot(*(cupdlp_float **)&in_R9->nMatElem,rhs_00,len_00);
    }
  }
  free(upper_00);
  free(rhs_00);
  return cVar3;
}

Assistant:

cupdlp_retcode cupdlp_l2norm_scaling(CUPDLPcsc *csc, cupdlp_float *cost,
                                     cupdlp_float *lower,
                                     cupdlp_float *upper,
                                     cupdlp_float *rhs,
                                     CUPDLPscaling *scaling)
// cupdlp_retcode cupdlp_l2norm_scaling(CUPDLPwork *work)
{
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;

  cupdlp_float *current_col_scaling = NULL;  // for variable
  cupdlp_float *current_row_scaling = NULL;  // for constraint
  CUPDLP_INIT_ZERO_DOUBLE(current_col_scaling, nCols);
  CUPDLP_INIT_ZERO_DOUBLE(current_row_scaling, nRows);

  if (nRows > 0) {
    for (int j = 0; j < nCols; j++) {
      if (csc->colMatBeg[j] == csc->colMatBeg[j + 1]) {
        current_col_scaling[j] = 1.0;
      } else {
        current_col_scaling[j] =
            SQRTF(GenNorm(&csc->colMatElem[csc->colMatBeg[j]],
                          csc->colMatBeg[j + 1] - csc->colMatBeg[j], 2.0));
      }
    }

    for (int i = 0; i < csc->colMatBeg[nCols]; i++) {
      current_row_scaling[csc->colMatIdx[i]] += pow(csc->colMatElem[i], 2.0);
    }
    for (int i = 0; i < nRows; i++) {
      current_row_scaling[i] = SQRTF(SQRTF(current_row_scaling[i]));
      if (current_row_scaling[i] == 0.0) {
        current_row_scaling[i] = 1.0;
      }
    }
  }
  // apply scaling
  // scale_problem(work, current_col_scaling, current_row_scaling);
  scale_problem(csc, cost, lower, upper, rhs, current_col_scaling,
                current_row_scaling);

  // update scaling
  cupdlp_cdot(scaling->colScale, current_col_scaling, nCols);
  cupdlp_cdot(scaling->rowScale, current_row_scaling, nRows);

exit_cleanup:
  cupdlp_free(current_col_scaling);
  cupdlp_free(current_row_scaling);
  return retcode;
}